

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O3

void Js::InlineCache::OutputPropertyValue<false,_false,_(Js::CacheType)4,_(Js::SlotType)1>::impl
               (InlineCache *cache,Var instance,RecyclableObject *propertyObject,
               PropertyId propertyId,Var *propertyValue,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  DynamicObject *this;
  Var pvVar5;
  RecyclableObject *function;
  
  uVar3 = *(ushort *)((long)&cache->u + 8);
  if ((uVar3 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x1ac,"(cache->u.accessor.flags & InlineCacheGetterFlag)",
                                "cache->u.accessor.flags & InlineCacheGetterFlag");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = (cache->u).accessor.field_1.rawUInt16;
  }
  if ((uVar3 & 8) == 0) {
    this = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(propertyObject);
  }
  else {
    this = (cache->u).accessor.object;
  }
  pvVar5 = DynamicObject::GetInlineSlot(this,(uint)(cache->u).accessor.slotIndex);
  function = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
  pvVar5 = JavascriptOperators::CallGetter(function,instance,requestContext);
  *propertyValue = pvVar5;
  return;
}

Assistant:

static void impl(
                InlineCache* cache,
                Var const instance,
                RecyclableObject *const propertyObject,
                const PropertyId propertyId,
                Var *const propertyValue,
                ScriptContext *const requestContext)
            {
                Assert(cache->u.accessor.flags & InlineCacheGetterFlag);

                RecyclableObject * function;
                if (cache->u.accessor.isOnProto)
                {
                    function = UnsafeVarTo<RecyclableObject>(cache->GetPropertyValue<slotType>(cache->u.accessor.object, cache->u.accessor.slotIndex));
                }
                else
                {
                    function = UnsafeVarTo<RecyclableObject>(cache->GetPropertyValue<slotType>(UnsafeVarTo<DynamicObject>(propertyObject), cache->u.accessor.slotIndex));
                }

                *propertyValue = JavascriptOperators::CallGetter(function, instance, requestContext);

                // Can't assert because the getter could have a side effect
#ifdef CHKGETTER
                Assert(JavascriptOperators::Equal(*propertyValue, JavascriptOperators::GetProperty(propertyObject, propertyId, requestContext), requestContext));
#endif
            }